

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void legendre_associated_values(int *n_data,int *n,int *m,double *x,double *fx)

{
  double local_218;
  double x_vec [19];
  double local_178;
  double fx_vec [19];
  int local_d8 [2];
  int m_vec [19];
  int n_vec [19];
  double *fx_local;
  double *x_local;
  int *m_local;
  int *n_local;
  int *n_data_local;
  
  memcpy(m_vec + 0x12,&DAT_00264e00,0x4c);
  memcpy(local_d8,&DAT_00264e50,0x4c);
  memcpy(&local_178,&DAT_00264ea0,0x98);
  memcpy(&local_218,&DAT_00264f40,0x98);
  if (*n_data < 0) {
    *n_data = 0;
  }
  if (*n_data < 0x13) {
    *n = m_vec[(long)*n_data + 0x12];
    *m = m_vec[(long)*n_data + -2];
    *x = x_vec[(long)*n_data + -1];
    *fx = fx_vec[(long)*n_data + -1];
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *m = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  return;
}

Assistant:

void legendre_associated_values ( int *n_data, int *n, int *m, double *x, 
  double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED_VALUES returns values of associated Legendre functions.
//
//  Discussion:
//
//    The function considered is the associated Legendre function P^M_N(X).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and
//    N_DATA is set to the index of the test data.  On each subsequent
//    call, N_DATA is incremented and that test data is returned.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, int *M, double *X, the arguments of the function.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 19

  int n_vec[N_MAX] = {
     1,  1,  1,  1, 
     1,  2,  2,  2, 
     3,  3,  3,  3, 
     4,  5,  6,  7, 
     8,  9, 10 };
  int m_vec[N_MAX] = {
     0,  0,  0,  0, 
     1,  0,  1,  2, 
     0,  1,  2,  3, 
     2,  2,  3,  3, 
     4,  4,  5 };
  double fx_vec[N_MAX] = {
     0.000000,  0.500000,  0.707107,  1.000000, 
    -0.866025, -0.125000, -1.29904,   2.25000, 
    -0.437500, -0.324759,  5.62500,  -9.74278, 
     4.21875,  -4.92187,   12.7874,   116.685, 
    -1050.67,  -2078.49,   30086.2 };
  double x_vec[N_MAX] = {
    0.0,       0.5,       0.7071067, 1.0, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5,       0.5, 
    0.5,       0.5,       0.5 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *m = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *m = m_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}